

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix4d * __thiscall
math::Matrix4d::rotate_z(Matrix4d *__return_storage_ptr__,Matrix4d *this,double r)

{
  Matrix4d ret;
  Matrix4d local_98;
  
  identity();
  local_98.m_buffer[0][0] = cos(r);
  local_98.m_buffer[0][1] = sin(r);
  local_98.m_buffer[0][1] = -local_98.m_buffer[0][1];
  local_98.m_buffer[1][0] = sin(r);
  local_98.m_buffer[1][1] = cos(r);
  operator*(__return_storage_ptr__,&local_98,this);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::Matrix4d::rotate_z(double r) const
{
    Matrix4d ret{identity()};
    ret(0, 0) = std::cos(r);
    ret(0, 1) = -std::sin(r);
    ret(1, 0) = std::sin(r);
    ret(1, 1) = std::cos(r);
    return (ret * (*this));
}